

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * __thiscall
cmCompiledGeneratorExpression::Evaluate
          (cmCompiledGeneratorExpression *this,cmLocalGenerator *lg,string *config,
          cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
          cmGeneratorTarget *currentTarget,string *language)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  cmGeneratorTarget *local_220;
  string local_1e8;
  cmListFileBacktrace local_1c8;
  string local_1b8;
  undefined1 local_198 [8];
  cmGeneratorExpressionContext context;
  cmGeneratorTarget *currentTarget_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmCompiledGeneratorExpression *this_local;
  
  context._344_8_ = currentTarget;
  std::__cxx11::string::string((string *)&local_1b8,(string *)config);
  bVar1 = this->Quiet;
  local_220 = headTarget;
  if (context._344_8_ != 0) {
    local_220 = (cmGeneratorTarget *)context._344_8_;
  }
  bVar2 = this->EvaluateForBuildsystem;
  cmListFileBacktrace::cmListFileBacktrace(&local_1c8,&this->Backtrace);
  std::__cxx11::string::string((string *)&local_1e8,(string *)language);
  cmGeneratorExpressionContext::cmGeneratorExpressionContext
            ((cmGeneratorExpressionContext *)local_198,lg,&local_1b8,(bool)(bVar1 & 1),headTarget,
             local_220,(bool)(bVar2 & 1),&local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1b8);
  psVar3 = EvaluateWithContext_abi_cxx11_(this,(cmGeneratorExpressionContext *)local_198,dagChecker)
  ;
  cmGeneratorExpressionContext::~cmGeneratorExpressionContext
            ((cmGeneratorExpressionContext *)local_198);
  return psVar3;
}

Assistant:

const std::string& cmCompiledGeneratorExpression::Evaluate(
  cmLocalGenerator* lg, const std::string& config,
  const cmGeneratorTarget* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const cmGeneratorTarget* currentTarget, std::string const& language) const
{
  cmGeneratorExpressionContext context(
    lg, config, this->Quiet, headTarget,
    currentTarget ? currentTarget : headTarget, this->EvaluateForBuildsystem,
    this->Backtrace, language);

  return this->EvaluateWithContext(context, dagChecker);
}